

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt1.cpp
# Opt level: O0

void __thiscall crnlib::qdxt1::~qdxt1(qdxt1 *this)

{
  vector<crnlib::vector<unsigned_int>_> *local_18;
  qdxt1 *this_local;
  
  spinlock::~spinlock(&this->m_cluster_hash_lock);
  hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
  ::~hash_map(&this->m_cluster_hash);
  local_18 = (vector<crnlib::vector<unsigned_int>_> *)&this->m_cluster_hash;
  do {
    local_18 = local_18 + -1;
    vector<crnlib::vector<unsigned_int>_>::~vector(local_18);
  } while (local_18 != this->m_cached_selector_cluster_indices);
  threaded_clusterizer<crnlib::vec<16U,_float>_>::~threaded_clusterizer
            (&this->m_selector_clusterizer);
  vector<crnlib::vector<unsigned_int>_>::~vector(&this->m_endpoint_cluster_indices);
  clusterizer<crnlib::vec<6U,_float>_>::~clusterizer(&this->m_endpoint_clusterizer);
  return;
}

Assistant:

qdxt1::~qdxt1()
    {
    }